

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> * __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::readImage
          (MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
           *__return_storage_ptr__,CopiesAndBlittingTestInstance *this,VkImage image,
          ImageParms *parms)

{
  bool bVar1;
  TextureLevel *this_00;
  TextureFormat imageFormat;
  TextureLevel depthTexture;
  PixelBufferAccess local_a8;
  PixelBufferAccess local_80;
  PixelBufferAccess local_58;
  
  imageFormat = ::vk::mapVkFormat(parms->format);
  this_00 = (TextureLevel *)operator_new(0x28);
  tcu::TextureLevel::TextureLevel
            (this_00,&imageFormat,(parms->extent).width,(parms->extent).height,(parms->extent).depth
            );
  (__return_storage_ptr__->
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>).m_data.ptr = this_00;
  bVar1 = tcu::isCombinedDepthStencilType(imageFormat.type);
  if (bVar1) {
    bVar1 = tcu::hasDepthComponent(imageFormat.order);
    if (bVar1) {
      local_a8.super_ConstPixelBufferAccess.m_format =
           mapCombinedToDepthTransferFormat(&imageFormat);
      tcu::TextureLevel::TextureLevel
                (&depthTexture,(TextureFormat *)&local_a8,(parms->extent).width,
                 (parms->extent).height,(parms->extent).depth);
      tcu::TextureLevel::getAccess(&local_a8,&depthTexture);
      readImageAspect(this,image,&local_a8,parms);
      tcu::TextureLevel::getAccess(&local_58,this_00);
      tcu::getEffectiveDepthStencilAccess(&local_a8,&local_58,MODE_DEPTH);
      tcu::TextureLevel::getAccess(&local_80,&depthTexture);
      tcu::copy((EVP_PKEY_CTX *)&local_a8,(EVP_PKEY_CTX *)&local_80);
      tcu::TextureLevel::~TextureLevel(&depthTexture);
    }
    bVar1 = tcu::hasStencilComponent(imageFormat.order);
    if (bVar1) {
      local_a8.super_ConstPixelBufferAccess.m_format =
           tcu::getEffectiveDepthStencilTextureFormat(&imageFormat,MODE_STENCIL);
      tcu::TextureLevel::TextureLevel
                (&depthTexture,(TextureFormat *)&local_a8,(parms->extent).width,
                 (parms->extent).height,(parms->extent).depth);
      tcu::TextureLevel::getAccess(&local_a8,&depthTexture);
      readImageAspect(this,image,&local_a8,parms);
      tcu::TextureLevel::getAccess(&local_58,this_00);
      tcu::getEffectiveDepthStencilAccess(&local_a8,&local_58,MODE_STENCIL);
      tcu::TextureLevel::getAccess(&local_80,&depthTexture);
      tcu::copy((EVP_PKEY_CTX *)&local_a8,(EVP_PKEY_CTX *)&local_80);
      tcu::TextureLevel::~TextureLevel(&depthTexture);
    }
  }
  else {
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&depthTexture,this_00);
    readImageAspect(this,image,(PixelBufferAccess *)&depthTexture,parms);
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<tcu::TextureLevel> CopiesAndBlittingTestInstance::readImage	(vk::VkImage		image,
																		 const ImageParms&	parms)
{
	const tcu::TextureFormat		imageFormat	= mapVkFormat(parms.format);
	de::MovePtr<tcu::TextureLevel>	resultLevel	(new tcu::TextureLevel(imageFormat, parms.extent.width, parms.extent.height, parms.extent.depth));

	if (tcu::isCombinedDepthStencilType(imageFormat.type))
	{
		if (tcu::hasDepthComponent(imageFormat.order))
		{
			tcu::TextureLevel	depthTexture	(mapCombinedToDepthTransferFormat(imageFormat), parms.extent.width, parms.extent.height, parms.extent.depth);
			readImageAspect(image, depthTexture.getAccess(), parms);
			tcu::copy(tcu::getEffectiveDepthStencilAccess(resultLevel->getAccess(), tcu::Sampler::MODE_DEPTH), depthTexture.getAccess());
		}

		if (tcu::hasStencilComponent(imageFormat.order))
		{
			tcu::TextureLevel	stencilTexture	(tcu::getEffectiveDepthStencilTextureFormat(imageFormat, tcu::Sampler::MODE_STENCIL), parms.extent.width, parms.extent.height, parms.extent.depth);
			readImageAspect(image, stencilTexture.getAccess(), parms);
			tcu::copy(tcu::getEffectiveDepthStencilAccess(resultLevel->getAccess(), tcu::Sampler::MODE_STENCIL), stencilTexture.getAccess());
		}
	}
	else
		readImageAspect(image, resultLevel->getAccess(), parms);

	return resultLevel;
}